

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_catalog_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::ScalarMacroCatalogEntry::Copy(ScalarMacroCatalogEntry *this,ClientContext *context)

{
  Catalog *catalog;
  SchemaCatalogEntry *schema;
  CreateMacroInfo *info;
  ScalarMacroCatalogEntry *this_00;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_30;
  
  (*(code *)(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config).
            home_directory._M_string_length)(&local_30);
  info = (CreateMacroInfo *)
         unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                   ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *
                    )&local_30);
  catalog = (Catalog *)(context->config).max_expression_depth;
  schema = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  this_00 = (ScalarMacroCatalogEntry *)operator_new(0x170);
  ScalarMacroCatalogEntry(this_00,catalog,schema,info);
  (this->super_MacroCatalogEntry).super_FunctionEntry.super_StandardEntry.super_InCatalogEntry.
  super_CatalogEntry._vptr_CatalogEntry = (_func_int **)this_00;
  if (local_30._M_head_impl != (CreateInfo *)0x0) {
    (*((local_30._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> ScalarMacroCatalogEntry::Copy(ClientContext &context) const {
	auto info_copy = GetInfo();
	auto &cast_info = info_copy->Cast<CreateMacroInfo>();
	auto result = make_uniq<ScalarMacroCatalogEntry>(catalog, schema, cast_info);
	return std::move(result);
}